

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ValueDriver * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
          (BumpAllocator *this,DriverKind *args,Expression *args_1,Symbol *args_2,
          AssignFlags *args_3)

{
  Expression *longestStaticPrefix;
  Symbol *in_RCX;
  ValueDriver *in_R8;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  bitmask<slang::ast::AssignFlags> in_stack_ffffffffffffffd7;
  Symbol *pSVar1;
  
  longestStaticPrefix =
       (Expression *)
       allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pSVar1 = in_RCX;
  bitmask<slang::ast::AssignFlags>::bitmask
            ((bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffffd7,
             *(AssignFlags *)&(in_R8->prefixExpression).ptr);
  slang::ast::ValueDriver::ValueDriver
            (in_R8,in_stack_ffffffffffffffd7.m_bits,longestStaticPrefix,in_RCX,
             (bitmask<slang::ast::AssignFlags>)(underlying_type)((ulong)pSVar1 >> 0x38));
  return (ValueDriver *)longestStaticPrefix;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }